

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

Vec_Int_t * Pdr_InvMinimizeLits(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose)

{
  int *piVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  Cnf_Dat_t *p_00;
  sat_solver *pSat;
  Vec_Int_t *p_01;
  int *piVar6;
  long lVar7;
  Gia_Man_t *pGVar8;
  ulong uVar9;
  ulong uVar10;
  timespec ts;
  uint local_7c;
  long local_60;
  timespec local_48;
  int *local_38;
  
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    local_60 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_60 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  piVar1 = vInv->pArray;
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  piVar6 = piVar1 + 1;
  iVar4 = *piVar1;
  local_38 = piVar6;
  if (iVar4 < 1) {
    Cnf_DataFree(p_00);
    iVar4 = (int)p_00;
  }
  else {
    local_7c = 0;
    uVar10 = 0;
    do {
      iVar5 = *piVar6;
      if (0 < iVar5) {
        uVar9 = 0;
        do {
          iVar4 = piVar6[uVar9 + 1];
          piVar6[uVar9 + 1] = -1;
          pSat = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
          pGVar8 = p;
          iVar5 = Pdr_InvCheck_int(p,vInv,0,pSat,1);
          if (iVar5 == 0) {
            if (fVerbose != 0) {
              Abc_Print((int)pGVar8,"Removing lit %d from clause %d.\n",uVar9 & 0xffffffff,
                        (ulong)local_7c);
            }
            uVar10 = (ulong)((int)uVar10 + 1);
          }
          else {
            piVar6[uVar9 + 1] = iVar4;
          }
          uVar9 = uVar9 + 1;
          sat_solver_delete(pSat);
          iVar5 = *piVar6;
        } while ((long)uVar9 < (long)iVar5);
        iVar4 = *piVar1;
      }
      local_7c = local_7c + 1;
      piVar6 = piVar6 + (long)iVar5 + 1;
    } while ((int)local_7c < iVar4);
    Cnf_DataFree(p_00);
    iVar4 = (int)p_00;
    if ((int)uVar10 != 0) {
      Abc_Print(iVar4,"Invariant minimization reduced %d literals (out of %d).  ",uVar10);
      bVar2 = 0 < (int)uVar10;
      goto LAB_005f2ede;
    }
  }
  bVar2 = false;
  Abc_Print(iVar4,"Invariant minimization did not change the invariant.  ");
LAB_005f2ede:
  iVar5 = 3;
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p_01 = (Vec_Int_t *)0x0;
  Abc_Print(iVar5,"%s =","Time");
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar7 + local_60) / 1000000.0);
  if (bVar2) {
    p_01 = (Vec_Int_t *)malloc(0x10);
    p_01->nCap = 1000;
    p_01->nSize = 0;
    piVar6 = (int *)malloc(4000);
    p_01->pArray = piVar6;
    Vec_IntPush(p_01,*piVar1);
    if (0 < *piVar1) {
      iVar4 = 0;
      piVar6 = local_38;
      do {
        iVar5 = 0;
        if (0 < (long)*piVar6) {
          lVar7 = 0;
          iVar5 = 0;
          do {
            lVar3 = lVar7 + 1;
            lVar7 = lVar7 + 1;
            iVar5 = iVar5 + (uint)(piVar6[lVar3] != -1);
          } while (*piVar6 != lVar7);
        }
        Vec_IntPush(p_01,iVar5);
        iVar5 = *piVar6;
        if (0 < iVar5) {
          lVar7 = 0;
          do {
            if (piVar6[lVar7 + 1] != -1) {
              Vec_IntPush(p_01,piVar6[lVar7 + 1]);
              iVar5 = *piVar6;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < iVar5);
        }
        iVar4 = iVar4 + 1;
        piVar6 = piVar6 + (long)iVar5 + 1;
      } while (iVar4 < *piVar1);
    }
    if ((long)vInv->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
    }
    Vec_IntPush(p_01,vInv->pArray[(long)vInv->nSize + -1]);
  }
  return p_01;
}

Assistant:

Vec_Int_t * Pdr_InvMinimizeLits( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose )
{
    Vec_Int_t * vRes = NULL;
    abctime clk = Abc_Clock();
    int i, k, nLits = 0, * pCube, * pList = Vec_IntArray(vInv), nRemoved = 0;
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat;
//    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Pdr_ForEachCube( pList, pCube, i )
    {
        nLits += pCube[0];
        for ( k = 0; k < pCube[0]; k++ )
        {
            int Save = pCube[k+1];
            pCube[k+1] = -1;
            //sat_solver_bookmark( pSat );
            pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
            if ( Pdr_InvCheck_int(p, vInv, 0, pSat, 1) )
                pCube[k+1] = Save;
            else
            {
                if ( fVerbose )
                Abc_Print(1, "Removing lit %d from clause %d.\n", k, i );
                nRemoved++;
            }
            sat_solver_delete( pSat );
            //sat_solver_rollback( pSat );
            //sat_solver_bookmark( pSat );
        }
    }
    Cnf_DataFree( pCnf );
    //sat_solver_delete( pSat );
    if ( nRemoved )
        Abc_Print(1, "Invariant minimization reduced %d literals (out of %d).  ", nRemoved, nLits );
    else
        Abc_Print(1, "Invariant minimization did not change the invariant.  " ); 
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( nRemoved > 0 ) // finished without timeout and removed some lits
    {
        vRes = Vec_IntAlloc( 1000 );
        Vec_IntPush( vRes, pList[0] );
        Pdr_ForEachCube( pList, pCube, i )
        {
            int nLits = 0;
            for ( k = 0; k < pCube[0]; k++ )
                if ( pCube[k+1] != -1 )
                    nLits++;
            Vec_IntPush( vRes, nLits );
            for ( k = 0; k < pCube[0]; k++ )
                if ( pCube[k+1] != -1 )
                    Vec_IntPush( vRes, pCube[k+1] );
        }
        Vec_IntPush( vRes, Vec_IntEntryLast(vInv) );
    }
    return vRes;
}